

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

bool __thiscall Js::FunctionBody::HasValidSourceInfo(FunctionBody *this)

{
  ScriptContext *this_00;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  SourceContextInfoMap *pSVar4;
  SourceContextInfo *pSVar5;
  undefined4 *puVar6;
  DynamicSourceContextInfoMap *pDVar7;
  SourceContextInfo *pSVar8;
  DWORD_PTR local_28;
  SourceContextInfo *local_20;
  SourceContextInfo *sourceContextInfo;
  FunctionBody *this_local;
  
  sourceContextInfo = (SourceContextInfo *)this;
  pSVar4 = ScriptContext::GetSourceContextInfoMap
                     ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
  if (pSVar4 != (SourceContextInfoMap *)0x0) {
    pSVar4 = ScriptContext::GetSourceContextInfoMap
                       ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
    local_28 = FunctionProxy::GetHostSourceContext((FunctionProxy *)this);
    bVar2 = JsUtil::
            BaseDictionary<unsigned_long,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetValue<unsigned_long>(pSVar4,&local_28,&local_20);
    pSVar8 = local_20;
    bVar3 = false;
    if (bVar2) {
      pSVar5 = FunctionProxy::GetSourceContextInfo((FunctionProxy *)this);
      bVar3 = pSVar8 == pSVar5;
    }
    if (bVar3) {
      return true;
    }
  }
  bVar3 = ParseableFunctionInfo::IsDynamicScript(&this->super_ParseableFunctionInfo);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xe41,"(this->IsDynamicScript())","this->IsDynamicScript()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pDVar7 = ScriptContext::GetDynamicSourceContextInfoMap
                     ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
  if (pDVar7 != (DynamicSourceContextInfoMap *)0x0) {
    pDVar7 = ScriptContext::GetDynamicSourceContextInfoMap
                       ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
    pSVar8 = FunctionProxy::GetSourceContextInfo((FunctionProxy *)this);
    bVar3 = JsUtil::
            BaseDictionary<unsigned_int,_SourceContextInfo_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetValue<unsigned_int>(pDVar7,&(pSVar8->field_5).hash,&local_20);
    if ((bVar3) &&
       (pSVar8 = FunctionProxy::GetSourceContextInfo((FunctionProxy *)this), local_20 == pSVar8)) {
      return true;
    }
  }
  pSVar8 = FunctionProxy::GetSourceContextInfo((FunctionProxy *)this);
  if ((pSVar8->isHostDynamicDocument & 1U) == 0) {
    this_00 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext;
    pSVar8 = FunctionProxy::GetSourceContextInfo((FunctionProxy *)this);
    this_local._7_1_ = ScriptContext::IsNoContextSourceContextInfo(this_00,pSVar8);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool FunctionBody::HasValidSourceInfo()
    {
        SourceContextInfo* sourceContextInfo;

        if (m_scriptContext->GetSourceContextInfoMap())
        {
            if(m_scriptContext->GetSourceContextInfoMap()->TryGetValue(this->GetHostSourceContext(), &sourceContextInfo) &&
                sourceContextInfo == this->GetSourceContextInfo())
            {
                return true;
            }
        }
        Assert(this->IsDynamicScript());

        if(m_scriptContext->GetDynamicSourceContextInfoMap())
        {
            if(m_scriptContext->GetDynamicSourceContextInfoMap()->TryGetValue(this->GetSourceContextInfo()->hash, &sourceContextInfo) &&
                sourceContextInfo == this->GetSourceContextInfo())
            {
                return true;
            }
        }

        // The SourceContextInfo will not be added to the dynamicSourceContextInfoMap, if they are host provided dynamic code. But they are valid source context info
        if (this->GetSourceContextInfo()->isHostDynamicDocument)
        {
            return true;
        }
        return m_scriptContext->IsNoContextSourceContextInfo(this->GetSourceContextInfo());
    }